

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-doc.c
# Opt level: O1

fy_document *
fy_document_build_internal
          (fy_parse_cfg *cfg,_func_int_fy_parser_ptr_void_ptr *parser_setup,void *user)

{
  int iVar1;
  fy_document *fyd;
  fy_eventp *pfVar2;
  bool bVar3;
  fy_parse_cfg *cfg_00;
  char *fmt;
  fy_parser fyp_data;
  fy_parser local_1f0;
  
  if (parser_setup == (_func_int_fy_parser_ptr_void_ptr *)0x0) {
    return (fy_document *)0x0;
  }
  cfg_00 = &doc_parse_default_cfg;
  if (cfg != (fy_parse_cfg *)0x0) {
    cfg_00 = cfg;
  }
  iVar1 = fy_parse_setup(&local_1f0,cfg_00);
  if (iVar1 != 0) {
    return (fy_document *)0x0;
  }
  iVar1 = (*parser_setup)(&local_1f0,user);
  if (iVar1 == 0) {
    fyd = fy_parse_load_document(&local_1f0);
    if (fyd == (fy_document *)0x0) {
      local_1f0._112_1_ = local_1f0._112_1_ & 0xef;
      if (((undefined1)local_1f0.cfg.flags & FYPCF_COLLECT_DIAG) == FYPCF_COLOR_AUTO) {
        fmt = "fy_parse_load_document() failed";
        fyd = (fy_document *)0x0;
        iVar1 = 0xbdb;
      }
      else {
        fyd = (fy_document *)0x0;
        fy_parser_diag(&local_1f0,4,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                       ,0xbe0,"fy_document_build_internal","fy_parse_load_document() failed");
        local_1f0._112_1_ = local_1f0._112_1_ & 0xef;
        fmt = "fy_parse_document_create() failed";
        iVar1 = 0xbe5;
      }
    }
    else {
      bVar3 = false;
      do {
        pfVar2 = fy_parse_private(&local_1f0);
        if (pfVar2 == (fy_eventp *)0x0) goto LAB_00120ecb;
        if ((pfVar2->e).type == FYET_STREAM_END) {
          bVar3 = true;
        }
        fy_parse_eventp_recycle(&local_1f0,pfVar2);
      } while (!bVar3);
      pfVar2 = fy_parse_private(&local_1f0);
      if (pfVar2 == (fy_eventp *)0x0) {
        fy_parse_eventp_recycle(&local_1f0,(fy_eventp *)0x0);
        goto LAB_00120ecb;
      }
      fmt = "more events after stream end";
      iVar1 = 0xbf6;
    }
  }
  else {
    fmt = "parser_setup() failed";
    fyd = (fy_document *)0x0;
    iVar1 = 0xbd1;
  }
  fy_parser_diag(&local_1f0,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                 ,iVar1,"fy_document_build_internal",fmt);
  fy_document_destroy(fyd);
  fyd = (fy_document *)0x0;
LAB_00120ecb:
  fy_parse_cleanup(&local_1f0);
  return fyd;
}

Assistant:

static struct fy_document *fy_document_build_internal(const struct fy_parse_cfg *cfg,
                                                      int (*parser_setup)(struct fy_parser *fyp, void *user),
                                                      void *user) {
    struct fy_parser fyp_data, *fyp = &fyp_data;
    struct fy_document *fyd = NULL;
    struct fy_eventp *fyep;
    bool got_stream_end;
    int rc;

    if (!parser_setup)
        return NULL;

    if (!cfg)
        cfg = &doc_parse_default_cfg;

    rc = fy_parse_setup(fyp, cfg);
    if (rc)
        return NULL;

    rc = (*parser_setup)(fyp, user);
    fyp_error_check(fyp, !rc, err_out,
                    "parser_setup() failed");

    fyd = fy_parse_load_document(fyp);

    /* we're going to handle stream errors from now */
    if (!fyd)
        fyp->stream_error = false;

    /* if we collect diagnostics, we can continue */
    fyp_error_check(fyp, fyd || (fyp->cfg.flags & FYPCF_COLLECT_DIAG), err_out,
                    "fy_parse_load_document() failed");

    /* no document, but we're collecting diagnostics */
    if (!fyd) {

        fyp_error(fyp, "fy_parse_load_document() failed");

        fyp->stream_error = false;
        fyd = fy_parse_document_create(fyp, NULL);
        fyp_error_check(fyp, fyd, err_out,
                        "fy_parse_document_create() failed");
        fyd->parse_error = true;

        /* XXX */
        goto out;
    }

    got_stream_end = false;
    while (!got_stream_end && (fyep = fy_parse_private(fyp)) != NULL) {
        if (fyep->e.type == FYET_STREAM_END)
            got_stream_end = true;
        fy_parse_eventp_recycle(fyp, fyep);
    }

    if (got_stream_end) {
        fyep = fy_parse_private(fyp);
        fyp_error_check(fyp, !fyep, err_out,
                        "more events after stream end");
        fy_parse_eventp_recycle(fyp, fyep);
    }

    out:
    fy_parse_cleanup(fyp);
    return fyd;

    err_out:
    fy_document_destroy(fyd);
    fy_parse_cleanup(fyp);
    return NULL;
}